

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddQuad(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *d,ImU32 col,
                   float thickness)

{
  int *piVar1;
  int iVar2;
  ImVec2 *pIVar3;
  uint uVar4;
  ImGuiContext *pIVar5;
  ImVec2 *pIVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  
  pIVar5 = GImGui;
  if (0xffffff < col) {
    iVar9 = (this->_Path).Size;
    iVar2 = (this->_Path).Capacity;
    if (iVar9 == iVar2) {
      iVar9 = iVar9 + 1;
      if (iVar2 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar2 / 2 + iVar2;
      }
      if (iVar9 < iVar8) {
        iVar9 = iVar8;
      }
      if (iVar2 < iVar9) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar6 = (ImVec2 *)(*(pIVar5->IO).MemAllocFn)((long)iVar9 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar6,pIVar3,(long)(this->_Path).Size << 3);
        }
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar3);
        (this->_Path).Data = pIVar6;
        (this->_Path).Capacity = iVar9;
      }
    }
    iVar9 = (this->_Path).Size;
    (this->_Path).Size = iVar9 + 1;
    (this->_Path).Data[iVar9] = *a;
    pIVar5 = GImGui;
    iVar9 = (this->_Path).Size;
    iVar2 = (this->_Path).Capacity;
    if (iVar9 == iVar2) {
      iVar9 = iVar9 + 1;
      if (iVar2 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar2 / 2 + iVar2;
      }
      if (iVar9 < iVar8) {
        iVar9 = iVar8;
      }
      if (iVar2 < iVar9) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar6 = (ImVec2 *)(*(pIVar5->IO).MemAllocFn)((long)iVar9 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar6,pIVar3,(long)(this->_Path).Size << 3);
        }
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar3);
        (this->_Path).Data = pIVar6;
        (this->_Path).Capacity = iVar9;
      }
    }
    iVar9 = (this->_Path).Size;
    (this->_Path).Size = iVar9 + 1;
    (this->_Path).Data[iVar9] = *b;
    pIVar5 = GImGui;
    iVar9 = (this->_Path).Size;
    iVar2 = (this->_Path).Capacity;
    if (iVar9 == iVar2) {
      iVar9 = iVar9 + 1;
      if (iVar2 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar2 / 2 + iVar2;
      }
      if (iVar9 < iVar8) {
        iVar9 = iVar8;
      }
      if (iVar2 < iVar9) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar6 = (ImVec2 *)(*(pIVar5->IO).MemAllocFn)((long)iVar9 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar6,pIVar3,(long)(this->_Path).Size << 3);
        }
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar3);
        (this->_Path).Data = pIVar6;
        (this->_Path).Capacity = iVar9;
      }
    }
    iVar9 = (this->_Path).Size;
    (this->_Path).Size = iVar9 + 1;
    (this->_Path).Data[iVar9] = *c;
    pIVar5 = GImGui;
    iVar9 = (this->_Path).Size;
    iVar2 = (this->_Path).Capacity;
    if (iVar9 == iVar2) {
      iVar9 = iVar9 + 1;
      if (iVar2 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar2 / 2 + iVar2;
      }
      if (iVar9 < iVar8) {
        iVar9 = iVar8;
      }
      if (iVar2 < iVar9) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar6 = (ImVec2 *)(*(pIVar5->IO).MemAllocFn)((long)iVar9 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar6,pIVar3,(long)(this->_Path).Size << 3);
        }
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar3);
        (this->_Path).Data = pIVar6;
        (this->_Path).Capacity = iVar9;
      }
    }
    iVar9 = (this->_Path).Size;
    (this->_Path).Size = iVar9 + 1;
    (this->_Path).Data[iVar9] = *d;
    AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,true,thickness,true);
    pIVar5 = GImGui;
    iVar9 = (this->_Path).Capacity;
    if (iVar9 < 0) {
      uVar7 = iVar9 / 2 + iVar9;
      uVar4 = 0;
      if (0 < (int)uVar7) {
        uVar4 = uVar7;
      }
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      pIVar6 = (ImVec2 *)(*(pIVar5->IO).MemAllocFn)((ulong)uVar4 * 8);
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(pIVar6,pIVar3,(long)(this->_Path).Size << 3);
      }
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar3);
      (this->_Path).Data = pIVar6;
      (this->_Path).Capacity = uVar4;
    }
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddQuad(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& d, ImU32 col, float thickness)
{
    if ((col >> 24) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathLineTo(d);
    PathStroke(col, true, thickness);
}